

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteObservations.h
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
MADPComponentDiscreteObservations::JointToIndividualObservationIndices
          (MADPComponentDiscreteObservations *this,Index joI)

{
  bool bVar1;
  undefined8 uVar2;
  JointObservationDiscrete *this_00;
  pointer ppVar3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__y;
  uint in_ESI;
  MADPComponentDiscreteObservations *in_RDI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *indices;
  map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>_>
  *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff68;
  pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*> *__x;
  map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>_>
  *in_stack_ffffffffffffff70;
  undefined1 local_60 [24];
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_48;
  _Base_ptr local_40;
  _Self local_38;
  _Self local_30 [3];
  uint local_14;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_8;
  
  if (((byte)in_RDI[10] & 1) == 0) {
    uVar2 = __cxa_allocate_exception(0x28);
    EOverflow::EOverflow
              ((EOverflow *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               (char *)in_stack_ffffffffffffff58);
    __cxa_throw(uVar2,&EOverflow::typeinfo,EOverflow::~EOverflow);
  }
  if (((byte)in_RDI[9] & 1) == 0) {
    local_14 = in_ESI;
    local_30[0]._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>_>
         ::find(in_stack_ffffffffffffff58,(key_type *)0x127c2e);
    local_38._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>_>
         ::end(in_stack_ffffffffffffff58);
    bVar1 = std::operator!=(local_30,&local_38);
    if (bVar1) {
      local_40 = (_Base_ptr)
                 std::
                 map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>_>
                 ::find(in_stack_ffffffffffffff58,(key_type *)0x127c74);
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                             *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
      local_8 = ppVar3->second;
    }
    else {
      __y = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)operator_new(0x18);
      memset(__y,0,0x18);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x127cba);
      local_48 = __y;
      GetNrObservations(in_RDI);
      IndexTools::JointToIndividualIndices((uint)local_60,(vector *)(ulong)local_14);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffff70,
                 in_stack_ffffffffffffff68);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffff70);
      __x = *(pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*> **)
             (in_RDI + 0x38);
      std::make_pair<unsigned_int&,std::vector<unsigned_int,std::allocator<unsigned_int>>*&>
                ((uint *)CONCAT44(local_14,in_stack_ffffffffffffff60),
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> **)__y);
      std::
      map<unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>*,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::vector<unsigned_int,std::allocator<unsigned_int>>*>>>
      ::insert<std::pair<unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>*>>
                (in_stack_ffffffffffffff70,__x);
      local_8 = local_48;
    }
  }
  else {
    this_00 = (JointObservationDiscrete *)
              MADPComponentDiscreteObservations::GetJointObservationDiscrete((uint)in_RDI);
    local_8 = JointObservationDiscrete::GetIndividualObservationDiscretesIndices(this_00);
  }
  return local_8;
}

Assistant:

const std::vector<Index>& 
            JointToIndividualObservationIndices(Index joI) const
        {
            if(!_m_jointIndicesValid)
            {
                throw(EOverflow("MADPComponentDiscreteObservations::JointToIndividualObservationIndices() joint indices are not available, overflow detected"));
            }
            if(_m_cachedAllJointObservations)
                return GetJointObservationDiscrete(joI)->
                    GetIndividualObservationDiscretesIndices();
            else if(_m_jointObservationIndices->find(joI)!=
                    _m_jointObservationIndices->end())
                return(*_m_jointObservationIndices->find(joI)->second);
            else // create new 
            {
                std::vector<Index> *indices=new std::vector<Index>();
                *indices=IndexTools::JointToIndividualIndices(joI,
                                                              GetNrObservations());
                _m_jointObservationIndices->insert(make_pair(joI,indices));
                return(*indices); // deleted in dtor
            }
        }